

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  undefined8 uVar1;
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  int in_ESI;
  uint *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  ImVec2 size;
  ImVec2 pos;
  ImFontAtlasCustomRect *r;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  ImFontAtlas *in_stack_ffffffffffffff40;
  ImVec2 local_50;
  undefined8 local_48;
  ImFontAtlasCustomRect *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  ImVec2 *local_28;
  ImVec2 *local_20;
  int local_14;
  bool local_1;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  
  if ((in_ESI < 0) || (8 < in_ESI)) {
    local_1 = false;
  }
  else if ((*in_RDI & 2) == 0) {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_40 = GetCustomRectByIndex(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    ImVec2::ImVec2(&local_50,(float)local_40->X,(float)local_40->Y);
    auVar2._0_8_ = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (ImVec2 *)0x58026f);
    auVar2._8_56_ = extraout_var;
    local_48 = vmovlpd_avx(auVar2._0_16_);
    *local_28 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[local_14][1];
    *local_20 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[local_14][2];
    auVar3._0_8_ = ::operator*((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (ImVec2 *)0x5802df);
    auVar3._8_56_ = extraout_var_00;
    uVar1 = vmovlpd_avx(auVar3._0_16_);
    *local_30 = uVar1;
    auVar4._0_8_ = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (ImVec2 *)0x580309);
    auVar4._8_56_ = extraout_var_01;
    vmovlpd_avx(auVar4._0_16_);
    auVar5._0_8_ = ::operator*((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (ImVec2 *)0x58031e);
    auVar5._8_56_ = extraout_var_02;
    uVar1 = vmovlpd_avx(auVar5._0_16_);
    local_30[1] = uVar1;
    local_48 = CONCAT44(local_48._4_4_,(float)local_48 + 123.0);
    auVar6._0_8_ = ::operator*((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (ImVec2 *)0x580362);
    auVar6._8_56_ = extraout_var_03;
    uVar1 = vmovlpd_avx(auVar6._0_16_);
    *local_38 = uVar1;
    auVar7._0_8_ = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (ImVec2 *)0x580387);
    auVar7._8_56_ = extraout_var_04;
    vmovlpd_avx(auVar7._0_16_);
    auVar8._0_8_ = ::operator*((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (ImVec2 *)0x58039c);
    auVar8._8_56_ = extraout_var_05;
    uVar1 = vmovlpd_avx(auVar8._0_16_);
    local_38[1] = uVar1;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(PackIdMouseCursors != -1);
    ImFontAtlasCustomRect* r = GetCustomRectByIndex(PackIdMouseCursors);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r->X, (float)r->Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}